

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jnt_convolve_ssse3.c
# Opt level: O2

void av1_dist_wtd_convolve_2d_ssse3
               (uint8_t *src,int src_stride,uint8_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params)

{
  int16_t *piVar1;
  undefined2 *puVar2;
  CONV_BUF_TYPE *pCVar3;
  undefined2 *puVar4;
  undefined2 *puVar5;
  undefined2 *puVar6;
  int iVar7;
  ushort uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [31];
  undefined1 auVar26 [31];
  undefined1 auVar27 [31];
  undefined1 auVar28 [31];
  undefined1 auVar29 [31];
  undefined1 auVar30 [31];
  undefined1 auVar31 [31];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  uint uVar46;
  ulong uVar47;
  uint uVar48;
  uint8_t *puVar49;
  ulong uVar50;
  char cVar51;
  long lVar52;
  int iVar53;
  uint uVar54;
  undefined1 *puVar55;
  CONV_BUF_TYPE *pCVar56;
  undefined4 uVar57;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  CONV_BUF_TYPE CVar65;
  CONV_BUF_TYPE CVar68;
  CONV_BUF_TYPE CVar69;
  CONV_BUF_TYPE CVar70;
  CONV_BUF_TYPE CVar71;
  CONV_BUF_TYPE CVar72;
  CONV_BUF_TYPE CVar73;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  CONV_BUF_TYPE CVar74;
  undefined4 uVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [15];
  undefined1 auVar85 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  short local_8b98;
  short sStack_8b96;
  short local_8b88;
  short sStack_8b86;
  undefined1 local_8b38 [1792];
  undefined1 local_8438 [33800];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar86 [16];
  undefined1 auVar91 [16];
  undefined1 auVar87 [16];
  undefined1 auVar92 [16];
  undefined1 auVar88 [16];
  undefined1 auVar93 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  
  uVar50._0_4_ = conv_params->round_0;
  uVar50._4_4_ = conv_params->round_1;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar50;
  cVar51 = (char)(uVar50._4_4_ + (undefined4)uVar50);
  uVar54 = (1 << (0x15U - cVar51 & 0x1f)) + (1 << (0x16U - cVar51 & 0x1f));
  uVar46 = 0xe - (uVar50._4_4_ + (undefined4)uVar50);
  piVar1 = filter_params_x->filter_ptr + (subpel_x_qn & 0xfU) * (uint)filter_params_x->taps;
  uVar75 = *(undefined4 *)piVar1;
  uVar39 = *(undefined4 *)(piVar1 + 2);
  uVar40 = *(undefined4 *)(piVar1 + 4);
  uVar41 = *(undefined4 *)(piVar1 + 6);
  iVar53 = ((1 << ((byte)(undefined4)uVar50 & 0x1f)) >> 1) + 0x4000;
  uVar8 = filter_params_y->taps;
  uVar48 = ((uint)uVar8 + h) - 1;
  uVar47 = 0;
  if ((int)uVar48 < 1) {
    uVar48 = 0;
  }
  iVar9 = conv_params->fwd_offset;
  iVar7 = conv_params->bck_offset;
  pCVar56 = conv_params->dst;
  iVar10 = conv_params->dst_stride;
  iVar11 = conv_params->do_average;
  iVar12 = conv_params->use_dist_wtd_comp_avg;
  auVar59._4_4_ = uVar75;
  auVar59._0_4_ = uVar75;
  auVar59._8_4_ = uVar75;
  auVar59._12_4_ = uVar75;
  auVar62._4_4_ = uVar39;
  auVar62._0_4_ = uVar39;
  auVar62._8_4_ = uVar39;
  auVar62._12_4_ = uVar39;
  auVar61._4_4_ = uVar40;
  auVar61._0_4_ = uVar40;
  auVar61._8_4_ = uVar40;
  auVar61._12_4_ = uVar40;
  auVar64._4_4_ = uVar41;
  auVar64._0_4_ = uVar41;
  auVar64._8_4_ = uVar41;
  auVar64._12_4_ = uVar41;
  puVar49 = src + (1 - ((long)(int)(((uVar8 >> 1) - 1) * src_stride) +
                       (ulong)(filter_params_x->taps >> 1)));
  puVar55 = local_8b38;
  for (; uVar47 != uVar48; uVar47 = uVar47 + 1) {
    for (lVar52 = 0; lVar52 < w; lVar52 = lVar52 + 8) {
      auVar58 = *(undefined1 (*) [16])(puVar49 + lVar52);
      auVar32[0xd] = 0;
      auVar32._0_13_ = auVar58._0_13_;
      auVar32[0xe] = auVar58[7];
      auVar33[0xc] = auVar58[6];
      auVar33._0_12_ = auVar58._0_12_;
      auVar33._13_2_ = auVar32._13_2_;
      auVar34[0xb] = 0;
      auVar34._0_11_ = auVar58._0_11_;
      auVar34._12_3_ = auVar33._12_3_;
      auVar35[10] = auVar58[5];
      auVar35._0_10_ = auVar58._0_10_;
      auVar35._11_4_ = auVar34._11_4_;
      auVar36[9] = 0;
      auVar36._0_9_ = auVar58._0_9_;
      auVar36._10_5_ = auVar35._10_5_;
      auVar37[8] = auVar58[4];
      auVar37._0_8_ = auVar58._0_8_;
      auVar37._9_6_ = auVar36._9_6_;
      auVar43._7_8_ = 0;
      auVar43._0_7_ = auVar37._8_7_;
      auVar44._1_8_ = SUB158(auVar43 << 0x40,7);
      auVar44[0] = auVar58[3];
      auVar44._9_6_ = 0;
      auVar45._1_10_ = SUB1510(auVar44 << 0x30,5);
      auVar45[0] = auVar58[2];
      auVar45._11_4_ = 0;
      auVar38[2] = auVar58[1];
      auVar38._0_2_ = auVar58._0_2_;
      auVar38._3_12_ = SUB1512(auVar45 << 0x20,3);
      auVar99._0_2_ = auVar58._0_2_ & 0xff;
      auVar99._2_13_ = auVar38._2_13_;
      auVar99[0xf] = 0;
      auVar84[1] = 0;
      auVar84[0] = auVar58[8];
      auVar84[2] = auVar58[9];
      auVar84[3] = 0;
      auVar84[4] = auVar58[10];
      auVar84[5] = 0;
      auVar84[6] = auVar58[0xb];
      auVar84[7] = 0;
      auVar84[8] = auVar58[0xc];
      auVar84[9] = 0;
      auVar84[10] = auVar58[0xd];
      auVar84[0xb] = 0;
      auVar84[0xc] = auVar58[0xe];
      auVar84[0xd] = 0;
      auVar84[0xe] = auVar58[0xf];
      auVar25._16_15_ = auVar84;
      auVar25._0_16_ = auVar99;
      auVar26._16_15_ = auVar84;
      auVar26._0_16_ = auVar99;
      auVar109 = pmaddwd(auVar26._8_16_,auVar61);
      auVar27._16_15_ = auVar84;
      auVar27._0_16_ = auVar99;
      auVar111 = pmaddwd(auVar27._12_16_,auVar64);
      auVar28._16_15_ = auVar84;
      auVar28._0_16_ = auVar99;
      auVar29._16_15_ = auVar84;
      auVar29._0_16_ = auVar99;
      auVar30._16_15_ = auVar84;
      auVar30._0_16_ = auVar99;
      auVar31._16_15_ = auVar84;
      auVar31._0_16_ = auVar99;
      auVar58 = pmaddwd(auVar99,auVar59);
      auVar103 = pmaddwd(auVar25._4_16_,auVar62);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar50 & 0xffffffff;
      auVar100._0_4_ =
           auVar58._0_4_ + iVar53 + auVar103._0_4_ + auVar111._0_4_ + auVar109._0_4_ >> auVar17;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = uVar50 & 0xffffffff;
      auVar100._4_4_ =
           auVar58._4_4_ + iVar53 + auVar103._4_4_ + auVar111._4_4_ + auVar109._4_4_ >> auVar18;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar50 & 0xffffffff;
      auVar100._8_4_ =
           auVar58._8_4_ + iVar53 + auVar103._8_4_ + auVar111._8_4_ + auVar109._8_4_ >> auVar19;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar50 & 0xffffffff;
      auVar100._12_4_ =
           auVar58._12_4_ + iVar53 + auVar103._12_4_ + auVar111._12_4_ + auVar109._12_4_ >> auVar20;
      auVar111 = pmaddwd(auVar28._2_16_,auVar59);
      auVar58 = pmaddwd(auVar29._6_16_,auVar62);
      auVar103 = pmaddwd(auVar30._10_16_,auVar61);
      auVar109 = pmaddwd(auVar31._14_16_,auVar64);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar50 & 0xffffffff;
      auVar110._0_4_ =
           auVar111._0_4_ + iVar53 + auVar103._0_4_ + auVar58._0_4_ + auVar109._0_4_ >> auVar21;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar50 & 0xffffffff;
      auVar110._4_4_ =
           auVar111._4_4_ + iVar53 + auVar103._4_4_ + auVar58._4_4_ + auVar109._4_4_ >> auVar22;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar50 & 0xffffffff;
      auVar110._8_4_ =
           auVar111._8_4_ + iVar53 + auVar103._8_4_ + auVar58._8_4_ + auVar109._8_4_ >> auVar23;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar50 & 0xffffffff;
      auVar110._12_4_ =
           auVar111._12_4_ + iVar53 + auVar103._12_4_ + auVar58._12_4_ + auVar109._12_4_ >> auVar24;
      auVar103 = packssdw(auVar100,auVar110);
      *(undefined1 (*) [16])(puVar55 + lVar52 * 2) = auVar103;
    }
    puVar49 = puVar49 + src_stride;
    puVar55 = puVar55 + 0x100;
  }
  local_8b88 = (short)iVar7;
  uVar57 = CONCAT22(local_8b88,(short)iVar9);
  auVar59 = pshuflw(auVar58,ZEXT416(uVar54),0);
  piVar1 = filter_params_y->filter_ptr + (subpel_y_qn & 0xfU) * (uint)uVar8;
  uVar75 = *(undefined4 *)piVar1;
  uVar39 = *(undefined4 *)(piVar1 + 2);
  uVar40 = *(undefined4 *)(piVar1 + 4);
  uVar41 = *(undefined4 *)(piVar1 + 6);
  iVar53 = (-1 << (0x15 - (byte)(undefined4)uVar50 & 0x1f)) +
           ((1 << ((byte)uVar50._4_4_ & 0x1f)) >> 1);
  auVar58 = ZEXT416((uint)uVar50._4_4_);
  auVar103._4_4_ = uVar75;
  auVar103._0_4_ = uVar75;
  auVar103._8_4_ = uVar75;
  auVar103._12_4_ = uVar75;
  auVar109._4_4_ = uVar39;
  auVar109._0_4_ = uVar39;
  auVar109._8_4_ = uVar39;
  auVar109._12_4_ = uVar39;
  auVar111._4_4_ = uVar41;
  auVar111._0_4_ = uVar41;
  auVar111._8_4_ = uVar41;
  auVar111._12_4_ = uVar41;
  auVar62 = ZEXT416(((uint)(1 << ((byte)uVar46 & 0x1f)) >> 1) - uVar54);
  auVar62 = pshuflw(auVar62,auVar62,0);
  uVar50 = 0;
  uVar47 = (ulong)(uint)h;
  if (h < 1) {
    uVar47 = 0;
  }
  puVar55 = local_8438;
  for (; uVar50 != uVar47; uVar50 = uVar50 + 1) {
    for (lVar52 = 0; lVar52 < w; lVar52 = lVar52 + 8) {
      auVar61 = *(undefined1 (*) [16])(puVar55 + lVar52 * 2 + -0x700);
      puVar4 = (undefined2 *)(puVar55 + lVar52 * 2 + -0x600);
      auVar64 = *(undefined1 (*) [16])(puVar55 + lVar52 * 2 + -0x500);
      auVar88._0_12_ = auVar61._0_12_;
      auVar88._12_2_ = auVar61._6_2_;
      auVar88._14_2_ = puVar4[3];
      auVar87._12_4_ = auVar88._12_4_;
      auVar87._0_10_ = auVar61._0_10_;
      auVar87._10_2_ = puVar4[2];
      auVar86._10_6_ = auVar87._10_6_;
      auVar86._0_8_ = auVar61._0_8_;
      auVar86._8_2_ = auVar61._4_2_;
      auVar85._8_8_ = auVar86._8_8_;
      auVar85._6_2_ = puVar4[1];
      auVar85._4_2_ = auVar61._2_2_;
      auVar85._0_2_ = auVar61._0_2_;
      auVar85._2_2_ = *puVar4;
      puVar5 = (undefined2 *)(puVar55 + lVar52 * 2 + -0x400);
      auVar108._0_12_ = auVar64._0_12_;
      auVar108._12_2_ = auVar64._6_2_;
      auVar108._14_2_ = puVar5[3];
      auVar89._12_4_ = auVar108._12_4_;
      auVar89._0_10_ = auVar64._0_10_;
      auVar89._10_2_ = puVar5[2];
      auVar102._10_6_ = auVar89._10_6_;
      auVar102._0_8_ = auVar64._0_8_;
      auVar102._8_2_ = auVar64._4_2_;
      auVar66._8_8_ = auVar102._8_8_;
      auVar66._6_2_ = puVar5[1];
      auVar66._4_2_ = auVar64._2_2_;
      auVar66._0_2_ = auVar64._0_2_;
      auVar66._2_2_ = *puVar5;
      auVar77 = *(undefined1 (*) [16])(puVar55 + lVar52 * 2 + -0x300);
      puVar6 = (undefined2 *)(puVar55 + lVar52 * 2 + -0x200);
      auVar107._0_12_ = auVar77._0_12_;
      auVar107._12_2_ = auVar77._6_2_;
      auVar107._14_2_ = puVar6[3];
      auVar106._12_4_ = auVar107._12_4_;
      auVar106._0_10_ = auVar77._0_10_;
      auVar106._10_2_ = puVar6[2];
      auVar105._10_6_ = auVar106._10_6_;
      auVar105._0_8_ = auVar77._0_8_;
      auVar105._8_2_ = auVar77._4_2_;
      auVar104._8_8_ = auVar105._8_8_;
      auVar104._6_2_ = puVar6[1];
      auVar104._4_2_ = auVar77._2_2_;
      auVar104._0_2_ = auVar77._0_2_;
      auVar104._2_2_ = *puVar6;
      auVar102 = *(undefined1 (*) [16])(puVar55 + lVar52 * 2 + -0x100);
      puVar2 = (undefined2 *)(puVar55 + lVar52 * 2);
      auVar89 = pmaddwd(auVar85,auVar103);
      auVar66 = pmaddwd(auVar66,auVar109);
      auVar93._0_12_ = auVar102._0_12_;
      auVar93._12_2_ = auVar102._6_2_;
      auVar93._14_2_ = puVar2[3];
      auVar92._12_4_ = auVar93._12_4_;
      auVar92._0_10_ = auVar102._0_10_;
      auVar92._10_2_ = puVar2[2];
      auVar91._10_6_ = auVar92._10_6_;
      auVar91._0_8_ = auVar102._0_8_;
      auVar91._8_2_ = auVar102._4_2_;
      auVar90._8_8_ = auVar91._8_8_;
      auVar90._6_2_ = puVar2[1];
      auVar90._4_2_ = auVar102._2_2_;
      auVar90._0_2_ = auVar102._0_2_;
      auVar90._2_2_ = *puVar2;
      auVar94._4_4_ = uVar40;
      auVar94._0_4_ = uVar40;
      auVar94._8_4_ = uVar40;
      auVar94._12_4_ = uVar40;
      auVar108 = pmaddwd(auVar104,auVar94);
      auVar94 = pmaddwd(auVar90,auVar111);
      auVar101._2_2_ = puVar4[4];
      auVar101._0_2_ = auVar61._8_2_;
      auVar101._4_2_ = auVar61._10_2_;
      auVar101._6_2_ = puVar4[5];
      auVar101._8_2_ = auVar61._12_2_;
      auVar101._10_2_ = puVar4[6];
      auVar101._12_2_ = auVar61._14_2_;
      auVar101._14_2_ = puVar4[7];
      auVar63._2_2_ = puVar5[4];
      auVar63._0_2_ = auVar64._8_2_;
      auVar63._4_2_ = auVar64._10_2_;
      auVar63._6_2_ = puVar5[5];
      auVar63._8_2_ = auVar64._12_2_;
      auVar63._10_2_ = puVar5[6];
      auVar63._12_2_ = auVar64._14_2_;
      auVar63._14_2_ = puVar5[7];
      auVar60._2_2_ = puVar6[4];
      auVar60._0_2_ = auVar77._8_2_;
      auVar60._4_2_ = auVar77._10_2_;
      auVar60._6_2_ = puVar6[5];
      auVar60._8_2_ = auVar77._12_2_;
      auVar60._10_2_ = puVar6[6];
      auVar60._12_2_ = auVar77._14_2_;
      auVar60._14_2_ = puVar6[7];
      auVar76._2_2_ = puVar2[4];
      auVar76._0_2_ = auVar102._8_2_;
      auVar76._4_2_ = auVar102._10_2_;
      auVar76._6_2_ = puVar2[5];
      auVar76._8_2_ = auVar102._12_2_;
      auVar76._10_2_ = puVar2[6];
      auVar76._12_2_ = auVar102._14_2_;
      auVar76._14_2_ = puVar2[7];
      auVar102 = pmaddwd(auVar101,auVar103);
      auVar64 = pmaddwd(auVar63,auVar109);
      auVar77._4_4_ = uVar40;
      auVar77._0_4_ = uVar40;
      auVar77._8_4_ = uVar40;
      auVar77._12_4_ = uVar40;
      auVar61 = pmaddwd(auVar60,auVar77);
      auVar77 = pmaddwd(auVar76,auVar111);
      auVar67._0_4_ =
           auVar94._0_4_ + auVar108._0_4_ + auVar66._0_4_ + auVar89._0_4_ + iVar53 >> auVar58;
      auVar67._4_4_ =
           auVar77._0_4_ + auVar61._0_4_ + auVar64._0_4_ + auVar102._0_4_ + iVar53 >> auVar58;
      auVar67._8_4_ =
           auVar94._4_4_ + auVar108._4_4_ + auVar66._4_4_ + auVar89._4_4_ + iVar53 >> auVar58;
      auVar67._12_4_ =
           auVar77._4_4_ + auVar61._4_4_ + auVar64._4_4_ + auVar102._4_4_ + iVar53 >> auVar58;
      auVar95._0_4_ =
           auVar94._8_4_ + auVar108._8_4_ + auVar66._8_4_ + auVar89._8_4_ + iVar53 >> auVar58;
      auVar95._4_4_ =
           auVar77._8_4_ + auVar61._8_4_ + auVar64._8_4_ + auVar102._8_4_ + iVar53 >> auVar58;
      auVar95._8_4_ =
           auVar94._12_4_ + auVar108._12_4_ + auVar66._12_4_ + auVar89._12_4_ + iVar53 >> auVar58;
      auVar95._12_4_ =
           auVar77._12_4_ + auVar61._12_4_ + auVar64._12_4_ + auVar102._12_4_ + iVar53 >> auVar58;
      auVar61 = packssdw(auVar67,auVar95);
      local_8b88 = auVar59._0_2_;
      sStack_8b86 = auVar59._2_2_;
      CVar65 = auVar61._0_2_ + local_8b88;
      CVar68 = auVar61._2_2_ + sStack_8b86;
      CVar69 = auVar61._4_2_ + local_8b88;
      CVar70 = auVar61._6_2_ + sStack_8b86;
      CVar71 = auVar61._8_2_ + local_8b88;
      CVar72 = auVar61._10_2_ + sStack_8b86;
      CVar73 = auVar61._12_2_ + local_8b88;
      CVar74 = auVar61._14_2_ + sStack_8b86;
      if (iVar11 == 0) {
        pCVar3 = pCVar56 + lVar52;
        *pCVar3 = CVar65;
        pCVar3[1] = CVar68;
        pCVar3[2] = CVar69;
        pCVar3[3] = CVar70;
        pCVar3[4] = CVar71;
        pCVar3[5] = CVar72;
        pCVar3[6] = CVar73;
        pCVar3[7] = CVar74;
      }
      else {
        auVar61 = *(undefined1 (*) [16])(pCVar56 + lVar52);
        if (iVar12 == 0) {
          auVar98._0_2_ = auVar61._0_2_ + CVar65;
          auVar98._2_2_ = auVar61._2_2_ + CVar68;
          auVar98._4_2_ = auVar61._4_2_ + CVar69;
          auVar98._6_2_ = auVar61._6_2_ + CVar70;
          auVar98._8_2_ = auVar61._8_2_ + CVar71;
          auVar98._10_2_ = auVar61._10_2_ + CVar72;
          auVar98._12_2_ = auVar61._12_2_ + CVar73;
          auVar98._14_2_ = auVar61._14_2_ + CVar74;
          auVar61 = psraw(auVar98,1);
        }
        else {
          auVar81._0_12_ = auVar61._0_12_;
          auVar81._12_2_ = auVar61._6_2_;
          auVar81._14_2_ = CVar70;
          auVar80._12_4_ = auVar81._12_4_;
          auVar80._0_10_ = auVar61._0_10_;
          auVar80._10_2_ = CVar69;
          auVar79._10_6_ = auVar80._10_6_;
          auVar79._0_8_ = auVar61._0_8_;
          auVar79._8_2_ = auVar61._4_2_;
          auVar78._8_8_ = auVar79._8_8_;
          auVar78._6_2_ = CVar68;
          auVar78._4_2_ = auVar61._2_2_;
          auVar78._2_2_ = CVar65;
          auVar78._0_2_ = auVar61._0_2_;
          auVar96._2_2_ = CVar71;
          auVar96._0_2_ = auVar61._8_2_;
          auVar96._4_2_ = auVar61._10_2_;
          auVar96._6_2_ = CVar72;
          auVar96._8_2_ = auVar61._12_2_;
          auVar96._10_2_ = CVar73;
          auVar96._12_2_ = auVar61._14_2_;
          auVar96._14_2_ = CVar74;
          auVar42._4_4_ = uVar57;
          auVar42._0_4_ = uVar57;
          auVar42._8_4_ = uVar57;
          auVar42._12_4_ = uVar57;
          auVar61 = pmaddwd(auVar78,auVar42);
          auVar64 = pmaddwd(auVar96,auVar42);
          auVar82._0_4_ = auVar61._0_4_ >> 4;
          auVar82._4_4_ = auVar61._4_4_ >> 4;
          auVar82._8_4_ = auVar61._8_4_ >> 4;
          auVar82._12_4_ = auVar61._12_4_ >> 4;
          auVar97._0_4_ = auVar64._0_4_ >> 4;
          auVar97._4_4_ = auVar64._4_4_ >> 4;
          auVar97._8_4_ = auVar64._8_4_ >> 4;
          auVar97._12_4_ = auVar64._12_4_ >> 4;
          auVar61 = packssdw(auVar82,auVar97);
        }
        local_8b98 = auVar62._0_2_;
        sStack_8b96 = auVar62._2_2_;
        auVar83._0_2_ = auVar61._0_2_ + local_8b98;
        auVar83._2_2_ = auVar61._2_2_ + sStack_8b96;
        auVar83._4_2_ = auVar61._4_2_ + local_8b98;
        auVar83._6_2_ = auVar61._6_2_ + sStack_8b96;
        auVar83._8_2_ = auVar61._8_2_ + local_8b98;
        auVar83._10_2_ = auVar61._10_2_ + sStack_8b96;
        auVar83._12_2_ = auVar61._12_2_ + local_8b98;
        auVar83._14_2_ = auVar61._14_2_ + sStack_8b96;
        auVar61 = psraw(auVar83,ZEXT416(uVar46));
        sVar13 = auVar61._0_2_;
        sVar14 = auVar61._2_2_;
        sVar15 = auVar61._4_2_;
        sVar16 = auVar61._6_2_;
        uVar75 = CONCAT13((0 < sVar16) * (sVar16 < 0x100) * auVar61[6] - (0xff < sVar16),
                          CONCAT12((0 < sVar15) * (sVar15 < 0x100) * auVar61[4] - (0xff < sVar15),
                                   CONCAT11((0 < sVar14) * (sVar14 < 0x100) * auVar61[2] -
                                            (0xff < sVar14),
                                            (0 < sVar13) * (sVar13 < 0x100) * auVar61[0] -
                                            (0xff < sVar13))));
        sVar13 = auVar61._8_2_;
        sVar14 = auVar61._10_2_;
        sVar15 = auVar61._12_2_;
        sVar16 = auVar61._14_2_;
        if (w < 5) {
          *(undefined4 *)(dst0 + lVar52) = uVar75;
        }
        else {
          *(ulong *)(dst0 + lVar52) =
               CONCAT17((0 < sVar16) * (sVar16 < 0x100) * auVar61[0xe] - (0xff < sVar16),
                        CONCAT16((0 < sVar15) * (sVar15 < 0x100) * auVar61[0xc] - (0xff < sVar15),
                                 CONCAT15((0 < sVar14) * (sVar14 < 0x100) * auVar61[10] -
                                          (0xff < sVar14),
                                          CONCAT14((0 < sVar13) * (sVar13 < 0x100) * auVar61[8] -
                                                   (0xff < sVar13),uVar75))));
        }
      }
    }
    pCVar56 = pCVar56 + iVar10;
    dst0 = dst0 + dst_stride0;
    puVar55 = puVar55 + 0x100;
  }
  return;
}

Assistant:

void av1_dist_wtd_convolve_2d_ssse3(
    const uint8_t *src, int src_stride, uint8_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int subpel_x_qn,
    const int subpel_y_qn, ConvolveParams *conv_params) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int bd = 8;

  DECLARE_ALIGNED(16, int16_t,
                  im_block[(MAX_SB_SIZE + MAX_FILTER_TAP - 1) * MAX_SB_SIZE]);
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = MAX_SB_SIZE;
  int i, j;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const uint8_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

  const __m128i zero = _mm_setzero_si128();

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi16(w0);
  const __m128i wt1 = _mm_set1_epi16(w1);
  const __m128i wt = _mm_unpacklo_epi16(wt0, wt1);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi16((1 << rounding_shift) >> 1);

  /* Horizontal filter */
  {
    const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
        filter_params_x, subpel_x_qn & SUBPEL_MASK);
    const __m128i coeffs_x = _mm_loadu_si128((__m128i *)x_filter);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_x, coeffs_x);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_x, coeffs_x);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const = _mm_set1_epi32(
        ((1 << conv_params->round_0) >> 1) + (1 << (bd + FILTER_BITS - 1)));
    const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_0);

    for (i = 0; i < im_h; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i data =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);

        const __m128i src_lo = _mm_unpacklo_epi8(data, zero);
        const __m128i src_hi = _mm_unpackhi_epi8(data, zero);

        // Filter even-index pixels
        const __m128i res_0 = _mm_madd_epi16(src_lo, coeff_01);
        const __m128i src_2 = _mm_alignr_epi8(src_hi, src_lo, 4);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
        const __m128i src_4 = _mm_alignr_epi8(src_hi, src_lo, 8);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
        const __m128i src_6 = _mm_alignr_epi8(src_hi, src_lo, 12);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

        __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_4),
                                         _mm_add_epi32(res_2, res_6));
        res_even =
            _mm_sra_epi32(_mm_add_epi32(res_even, round_const), round_shift);

        // Filter odd-index pixels
        const __m128i src_1 = _mm_alignr_epi8(src_hi, src_lo, 2);
        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
        const __m128i src_3 = _mm_alignr_epi8(src_hi, src_lo, 6);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
        const __m128i src_5 = _mm_alignr_epi8(src_hi, src_lo, 10);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
        const __m128i src_7 = _mm_alignr_epi8(src_hi, src_lo, 14);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

        __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_5),
                                        _mm_add_epi32(res_3, res_7));
        res_odd =
            _mm_sra_epi32(_mm_add_epi32(res_odd, round_const), round_shift);

        // Pack in the column order 0, 2, 4, 6, 1, 3, 5, 7
        __m128i res = _mm_packs_epi32(res_even, res_odd);
        _mm_store_si128((__m128i *)&im_block[i * im_stride + j], res);
      }
    }
  }

  /* Vertical filter */
  {
    const int16_t *y_filter = av1_get_interp_filter_subpel_kernel(
        filter_params_y, subpel_y_qn & SUBPEL_MASK);
    const __m128i coeffs_y = _mm_loadu_si128((__m128i *)y_filter);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_y, coeffs_y);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_y, coeffs_y);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const = _mm_set1_epi32(
        ((1 << conv_params->round_1) >> 1) -
        (1 << (bd + 2 * FILTER_BITS - conv_params->round_0 - 1)));
    const __m128i round_shift = _mm_cvtsi32_si128(conv_params->round_1);

    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        // Filter even-index pixels
        const int16_t *data = &im_block[i * im_stride + j];
        const __m128i src_0 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 0 * im_stride),
                               *(__m128i *)(data + 1 * im_stride));
        const __m128i src_2 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 2 * im_stride),
                               *(__m128i *)(data + 3 * im_stride));
        const __m128i src_4 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 4 * im_stride),
                               *(__m128i *)(data + 5 * im_stride));
        const __m128i src_6 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 6 * im_stride),
                               *(__m128i *)(data + 7 * im_stride));

        const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

        const __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                               _mm_add_epi32(res_4, res_6));

        // Filter odd-index pixels
        const __m128i src_1 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 0 * im_stride),
                               *(__m128i *)(data + 1 * im_stride));
        const __m128i src_3 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 2 * im_stride),
                               *(__m128i *)(data + 3 * im_stride));
        const __m128i src_5 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 4 * im_stride),
                               *(__m128i *)(data + 5 * im_stride));
        const __m128i src_7 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 6 * im_stride),
                               *(__m128i *)(data + 7 * im_stride));

        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

        const __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_3),
                                              _mm_add_epi32(res_5, res_7));

        // Rearrange pixels back into the order 0 ... 7
        const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

        const __m128i res_lo_round =
            _mm_sra_epi32(_mm_add_epi32(res_lo, round_const), round_shift);
        const __m128i res_hi_round =
            _mm_sra_epi32(_mm_add_epi32(res_hi, round_const), round_shift);

        const __m128i res_16b = _mm_packs_epi32(res_lo_round, res_hi_round);
        const __m128i res_unsigned = _mm_add_epi16(res_16b, offset_const);

        // Accumulate values into the destination buffer
        if (do_average) {
          const __m128i data_ref_0 =
              _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));

          const __m128i comp_avg_res =
              comp_avg(&data_ref_0, &res_unsigned, &wt, use_dist_wtd_comp_avg);

          const __m128i round_result = convolve_rounding(
              &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

          const __m128i res_8 = _mm_packus_epi16(round_result, round_result);

          if (w > 4)
            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_8);
          else
            *(int *)(&dst0[i * dst_stride0 + j]) = _mm_cvtsi128_si32(res_8);
        } else {
          _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_unsigned);
        }
      }
    }
  }
}